

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::
WritePropertyWithDefault<std::unordered_set<duckdb::QualifiedColumnName,duckdb::QualifiedColumnHashFunction,duckdb::QualifiedColumnEquality,std::allocator<duckdb::QualifiedColumnName>>>
          (Serializer *this,field_id_t field_id,char *tag,
          unordered_set<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<duckdb::QualifiedColumnName>_>
          *value,unordered_set<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<duckdb::QualifiedColumnName>_>
                 *default_value)

{
  bool bVar1;
  byte bVar2;
  
  if ((this->options).serialize_default_values == false) {
    bVar1 = ::std::__detail::
            _Equality<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            ::_M_equal((_Equality<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                        *)value,&default_value->_M_h);
    if (bVar1) {
      bVar2 = 0;
      (*this->_vptr_Serializer[4])(this,(ulong)field_id,tag,0);
      goto LAB_0178a32c;
    }
  }
  (*this->_vptr_Serializer[4])(this,(ulong)field_id,tag,1);
  WriteValue<duckdb::QualifiedColumnName,duckdb::QualifiedColumnHashFunction,duckdb::QualifiedColumnEquality>
            (this,value);
  bVar2 = 1;
LAB_0178a32c:
  (*this->_vptr_Serializer[5])(this,(ulong)bVar2);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}